

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall sglr::rc::Texture3D::updateView(Texture3D *this,DepthStencilMode mode)

{
  bool bVar1;
  int iVar2;
  int y;
  ConstPixelBufferAccess *pCVar3;
  Sampler *pSVar4;
  int local_5c;
  Texture3DView local_50;
  Texture3DView local_40;
  int local_2c;
  undefined1 local_25;
  int numLevels;
  int iStack_20;
  bool isMipmap;
  int depth;
  int height;
  int width;
  int baseLevel;
  DepthStencilMode mode_local;
  Texture3D *this_local;
  
  width = mode;
  _baseLevel = this;
  height = Texture::getBaseLevel(&this->super_Texture);
  bVar1 = hasLevel(this,height);
  if (bVar1) {
    pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
    bVar1 = isEmpty(pCVar3);
    if (!bVar1) {
      pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
      depth = tcu::ConstPixelBufferAccess::getWidth(pCVar3);
      pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
      iStack_20 = tcu::ConstPixelBufferAccess::getHeight(pCVar3);
      pCVar3 = &getLevel(this,height)->super_ConstPixelBufferAccess;
      numLevels = tcu::ConstPixelBufferAccess::getDepth(pCVar3);
      pSVar4 = Texture::getSampler(&this->super_Texture);
      local_25 = isMipmapFilter(pSVar4->minFilter);
      if ((bool)local_25) {
        iVar2 = Texture::getMaxLevel(&this->super_Texture);
        iVar2 = iVar2 - height;
        y = getNumMipLevels3D(depth,iStack_20,numLevels);
        local_5c = de::min<int>(iVar2 + 1,y);
      }
      else {
        local_5c = 1;
      }
      local_2c = local_5c;
      TextureLevelArray::updateSamplerMode(&this->m_levels,width);
      iVar2 = local_2c;
      pCVar3 = TextureLevelArray::getEffectiveLevels(&this->m_levels);
      tcu::Texture3DView::Texture3DView(&local_40,iVar2,pCVar3 + height);
      (this->m_view).m_numLevels = local_40.m_numLevels;
      *(undefined4 *)&(this->m_view).field_0x4 = local_40._4_4_;
      (this->m_view).m_levels = local_40.m_levels;
      return;
    }
  }
  tcu::Texture3DView::Texture3DView(&local_50,0,(ConstPixelBufferAccess *)0x0);
  (this->m_view).m_numLevels = local_50.m_numLevels;
  *(undefined4 *)&(this->m_view).field_0x4 = local_50._4_4_;
  (this->m_view).m_levels = local_50.m_levels;
  return;
}

Assistant:

void Texture3D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const int	depth		= getLevel(baseLevel).getDepth();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels3D(width, height, depth)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture3DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture3DView(0, DE_NULL);
}